

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3TableAffinity(Vdbe *v,Table *pTab,int iReg)

{
  sqlite3 *db;
  int n;
  char *z;
  long lVar1;
  long lVar2;
  
  z = pTab->zColAff;
  if (z == (char *)0x0) {
    db = v->db;
    z = (char *)sqlite3Malloc((long)pTab->nCol + 1);
    if (z == (char *)0x0) {
      sqlite3OomFault(db);
      return;
    }
    lVar2 = 0x19;
    for (lVar1 = 0; lVar1 < pTab->nCol; lVar1 = lVar1 + 1) {
      z[lVar1] = *(char *)((long)&pTab->aCol->zName + lVar2);
      lVar2 = lVar2 + 0x20;
    }
    do {
      z[lVar1] = '\0';
      if (lVar1 < 1) break;
      lVar2 = lVar1 + -1;
      lVar1 = lVar1 + -1;
    } while (z[lVar2] == 'A');
    pTab->zColAff = z;
  }
  n = sqlite3Strlen30(z);
  if (n != 0) {
    if (iReg == 0) {
      sqlite3VdbeChangeP4(v,-1,z,n);
      return;
    }
    sqlite3VdbeAddOp4(v,0x62,iReg,n,0,z,n);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3TableAffinity(Vdbe *v, Table *pTab, int iReg){
  int i;
  char *zColAff = pTab->zColAff;
  if( zColAff==0 ){
    sqlite3 *db = sqlite3VdbeDb(v);
    zColAff = (char *)sqlite3DbMallocRaw(0, pTab->nCol+1);
    if( !zColAff ){
      sqlite3OomFault(db);
      return;
    }

    for(i=0; i<pTab->nCol; i++){
      zColAff[i] = pTab->aCol[i].affinity;
    }
    do{
      zColAff[i--] = 0;
    }while( i>=0 && zColAff[i]==SQLITE_AFF_BLOB );
    pTab->zColAff = zColAff;
  }
  i = sqlite3Strlen30(zColAff);
  if( i ){
    if( iReg ){
      sqlite3VdbeAddOp4(v, OP_Affinity, iReg, i, 0, zColAff, i);
    }else{
      sqlite3VdbeChangeP4(v, -1, zColAff, i);
    }
  }
}